

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O2

void __thiscall
Http2::FrameWriter::start(FrameWriter *this,FrameType type,FrameFlags flags,quint32 streamID)

{
  reference pvVar1;
  FrameType *pFVar2;
  uint *puVar3;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,9);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,0);
  *pvVar1 = '\0';
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,1);
  *pvVar1 = '\0';
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,2);
  *pvVar1 = '\0';
  pFVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,3);
  *pFVar2 = type;
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,4);
  *pvVar1 = (value_type)
            flags.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
            super_QFlagsStorage<Http2::FrameFlag>.i;
  puVar3 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,5);
  *puVar3 = streamID >> 0x18 | (streamID & 0xff0000) >> 8 | (streamID & 0xff00) << 8 |
            streamID << 0x18;
  return;
}

Assistant:

void FrameWriter::start(FrameType type, FrameFlags flags, quint32 streamID)
{
    auto &buffer = frame.buffer;

    buffer.resize(frameHeaderSize);
    // The first three bytes - payload size, which is 0 for now.
    buffer[0] = 0;
    buffer[1] = 0;
    buffer[2] = 0;

    buffer[3] = uchar(type);
    buffer[4] = uchar(flags);

    qToBigEndian(streamID, &buffer[5]);
}